

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

bool __thiscall QFormLayout::isRowVisible(QFormLayout *this,int row)

{
  QFormLayoutItem *pQVar1;
  bool bVar2;
  QFormLayoutItem **ppQVar3;
  QWidget *pQVar4;
  int visibleItemCount;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  QFormLayoutPrivate *d;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  QFormLayoutItem *this_00;
  
  d_func((QFormLayout *)0x4b395b);
  ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  this_00 = *ppQVar3;
  ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  pQVar1 = *ppQVar3;
  iVar5 = 2;
  if ((this_00 == (QFormLayoutItem *)0x0) || (bVar2 = QFormLayoutItem::isHidden(this_00), bVar2)) {
LAB_004b39e7:
    iVar5 = iVar5 + -1;
  }
  else {
    pQVar4 = QFormLayoutItem::widget((QFormLayoutItem *)0x4b39c9);
    if (pQVar4 != (QWidget *)0x0) {
      QFormLayoutItem::widget((QFormLayoutItem *)0x4b39d9);
      bVar2 = QWidget::isHidden((QWidget *)0x4b39e1);
      if (bVar2) goto LAB_004b39e7;
    }
  }
  if ((pQVar1 != (QFormLayoutItem *)0x0) && (bVar2 = QFormLayoutItem::isHidden(this_00), !bVar2)) {
    pQVar4 = QFormLayoutItem::widget((QFormLayoutItem *)0x4b3a12);
    if (pQVar4 == (QWidget *)0x0) goto LAB_004b3a3b;
    QFormLayoutItem::widget((QFormLayoutItem *)0x4b3a22);
    bVar2 = QWidget::isHidden((QWidget *)0x4b3a2a);
    if (!bVar2) goto LAB_004b3a3b;
  }
  iVar5 = iVar5 + -1;
LAB_004b3a3b:
  return 0 < iVar5;
}

Assistant:

bool QFormLayout::isRowVisible(int row) const
{
    Q_D(const QFormLayout);
    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);

    int visibleItemCount = 2;
    if (!label || label->isHidden() || (label->widget() && label->widget()->isHidden()))
        --visibleItemCount;
    if (!field || field->isHidden() || (field->widget() && field->widget()->isHidden()))
        --visibleItemCount;

    return visibleItemCount > 0;
}